

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2_semi_mgau.c
# Opt level: O3

int s2_semi_mgau_frame_eval
              (s2_semi_mgau_t *s,ascr_t *ascr,fast_gmm_t *fgmm,mfcc_t **featbuf,int32 frame)

{
  byte bVar1;
  ushort uVar2;
  short sVar3;
  mfcc_t *feat;
  vqFeature_t *pvVar4;
  vqFeature_t vVar5;
  int32 *piVar6;
  uint8 *puVar7;
  uint8 **ppuVar8;
  uint8 *puVar9;
  uint8 *puVar10;
  uint8 *puVar11;
  uint8 *puVar12;
  uint8 *puVar13;
  uint8 *puVar14;
  void *pvVar15;
  mfcc_t *pmVar16;
  bool bVar17;
  vqFeature_t *pvVar18;
  long lVar19;
  kd_tree_node_t *pkVar20;
  short sVar21;
  long lVar22;
  int iVar23;
  mfcc_t *pmVar24;
  int iVar25;
  long lVar26;
  int iVar27;
  ulong uVar28;
  uint uVar29;
  ulong uVar30;
  long lVar31;
  mfcc_t *pmVar32;
  ulong uVar33;
  mfcc_t *pmVar34;
  int iVar35;
  uint uVar36;
  mfcc_t mVar37;
  float fVar38;
  
  memset(ascr->senscr,0,(long)s->n_sen << 2);
  iVar23 = frame % s->n_topn_hist;
  lVar22 = (long)iVar23;
  s->f = s->topn_hist[lVar22];
  if (0 < s->n_feat) {
    lVar26 = 0;
    do {
      if (s->frame_idx <= frame) {
        lVar19 = lVar22;
        if (iVar23 == 0) {
          lVar19 = (long)s->n_topn_hist;
        }
        memcpy(s->f[lVar26],s->topn_hist[lVar19 + -1][lVar26],(long)s->max_topn << 3);
        feat = featbuf[lVar26];
        sVar21 = s->max_topn;
        if (0 < sVar21) {
          pvVar4 = s->f[lVar26];
          iVar35 = s->veclen[lVar26];
          uVar28 = 0;
          do {
            mVar37 = s->dets[lVar26][pvVar4[uVar28].codeword];
            if (0 < iVar35) {
              lVar19 = (long)(iVar35 * pvVar4[uVar28].codeword);
              lVar31 = 0;
              do {
                fVar38 = (float)feat[lVar31] - (float)s->means[lVar26][lVar19 + lVar31];
                mVar37 = (mfcc_t)((float)mVar37 -
                                 fVar38 * fVar38 * (float)s->vars[lVar26][lVar19 + lVar31]);
                lVar31 = lVar31 + 1;
              } while (iVar35 != (int)lVar31);
            }
            pvVar4[uVar28].score = (int)(float)mVar37;
            if (uVar28 != 0) {
              vVar5 = pvVar4[uVar28];
              uVar30 = uVar28;
              do {
                uVar33 = uVar30 - 1 & 0xffffffff;
                if ((int)(float)mVar37 <= pvVar4[uVar33].score) goto LAB_0011a29a;
                pvVar4[uVar30] = pvVar4[uVar33];
                bVar17 = 1 < (long)uVar30;
                uVar30 = uVar30 - 1;
              } while (bVar17);
              uVar30 = 0;
LAB_0011a29a:
              pvVar4[(int)uVar30] = vVar5;
              sVar21 = s->max_topn;
            }
            uVar28 = uVar28 + 1;
          } while ((long)uVar28 < (long)sVar21);
        }
        if (frame % (int)s->ds_ratio == 0) {
          if (s->kdtrees == (kd_tree_t **)0x0) {
            sVar3 = s->n_density;
            if (0 < (long)sVar3) {
              pvVar4 = s->f[lVar26];
              pmVar16 = s->dets[lVar26];
              iVar35 = s->veclen[lVar26];
              pmVar32 = s->vars[lVar26];
              pmVar34 = s->means[lVar26];
              pmVar24 = pmVar16;
              do {
                mVar37 = *pmVar24;
                if (0 < iVar35) {
                  lVar19 = 0;
                  lVar31 = 0;
                  do {
                    if ((float)mVar37 < (float)pvVar4[(long)sVar21 + -1].score) {
                      pmVar34 = (mfcc_t *)((long)pmVar34 + ((iVar35 - lVar31) * 4 - lVar19));
                      pmVar32 = (mfcc_t *)((long)pmVar32 + ((iVar35 - lVar31) * 4 - lVar19));
                      goto LAB_0011ab90;
                    }
                    mVar37 = (mfcc_t)((float)mVar37 -
                                     ((float)feat[lVar31] - (float)pmVar34[lVar31]) *
                                     ((float)feat[lVar31] - (float)pmVar34[lVar31]) *
                                     (float)pmVar32[lVar31]);
                    lVar31 = lVar31 + 1;
                    lVar19 = lVar19 + -4;
                  } while (iVar35 != (int)lVar31);
                  pmVar34 = (mfcc_t *)((long)pmVar34 - lVar19);
                  pmVar32 = (mfcc_t *)((long)pmVar32 - lVar19);
                }
                iVar27 = (int)(float)mVar37;
                if (pvVar4[(long)sVar21 + -1].score <= iVar27) {
                  iVar25 = (int)((ulong)((long)pmVar24 - (long)pmVar16) >> 2);
                  pvVar18 = pvVar4 + (long)sVar21 + -2;
                  if (0 < (long)s->max_topn) {
                    lVar19 = 0;
                    do {
                      if (pvVar4[lVar19].codeword == iVar25) goto LAB_0011ab90;
                      lVar19 = lVar19 + 1;
                    } while (s->max_topn != lVar19);
                  }
                  for (; (pvVar4 <= pvVar18 && (pvVar18->score <= iVar27)); pvVar18 = pvVar18 + -1)
                  {
                    pvVar18[1] = *pvVar18;
                  }
                  pvVar18[1].codeword = iVar25;
                  pvVar18[1].score = iVar27;
                }
LAB_0011ab90:
                pmVar24 = pmVar24 + 1;
              } while (pmVar24 < pmVar16 + sVar3);
            }
          }
          else {
            pkVar20 = eval_kd_tree(s->kdtrees[lVar26],feat,s->kd_maxdepth);
            uVar36 = s->kd_maxbbi;
            uVar2 = pkVar20->n_bbi;
            uVar29 = (uint)uVar2;
            if ((int)uVar36 < (int)(uint)uVar2) {
              uVar29 = uVar36;
            }
            if (uVar36 == 0xffffffff) {
              uVar29 = (uint)uVar2;
            }
            if (uVar29 != 0) {
              pvVar4 = s->f[lVar26];
              sVar21 = s->max_topn;
              iVar35 = s->veclen[lVar26];
              uVar28 = 0;
              do {
                mVar37 = s->dets[lVar26][pkVar20->bbi[uVar28]];
                uVar36 = (uint)pkVar20->bbi[uVar28];
                if (0 < iVar35) {
                  lVar19 = 0;
                  do {
                    if ((float)mVar37 < (float)pvVar4[(long)sVar21 + -1].score) goto LAB_0011a452;
                    fVar38 = (float)feat[lVar19] -
                             (float)s->means[lVar26][(ulong)(iVar35 * uVar36) + lVar19];
                    mVar37 = (mfcc_t)((float)mVar37 -
                                     fVar38 * fVar38 *
                                     (float)s->vars[lVar26][(ulong)(iVar35 * uVar36) + lVar19]);
                    lVar19 = lVar19 + 1;
                  } while (iVar35 != (int)lVar19);
                }
                iVar27 = (int)(float)mVar37;
                if (pvVar4[(long)sVar21 + -1].score <= iVar27) {
                  pvVar18 = pvVar4 + (long)sVar21 + -2;
                  if (0 < (long)s->max_topn) {
                    lVar19 = 0;
                    do {
                      if (pvVar4[lVar19].codeword == uVar36) goto LAB_0011a452;
                      lVar19 = lVar19 + 1;
                    } while (s->max_topn != lVar19);
                  }
                  for (; (pvVar4 <= pvVar18 && (pvVar18->score <= iVar27)); pvVar18 = pvVar18 + -1)
                  {
                    pvVar18[1] = *pvVar18;
                  }
                  pvVar18[1].codeword = uVar36;
                  pvVar18[1].score = iVar27;
                }
LAB_0011a452:
                uVar28 = uVar28 + 1;
              } while (uVar28 != uVar29);
            }
          }
        }
        if (s->max_topn < 1) {
          lVar19 = 0;
        }
        else {
          pvVar4 = s->f[lVar26];
          iVar35 = pvVar4->score;
          lVar19 = 0;
          do {
            iVar27 = (iVar35 >> 10) - (pvVar4[lVar19].score >> 10);
            if (0x5f < iVar27) {
              iVar27 = 0x60;
            }
            pvVar4[lVar19].score = iVar27;
          } while (((s->topn_beam[lVar26] == 0) || (iVar27 <= (int)(uint)s->topn_beam[lVar26])) &&
                  (lVar19 = lVar19 + 1, lVar19 < s->max_topn));
        }
        s->topn_hist_n[lVar22][lVar26] = (uint8)lVar19;
      }
      bVar1 = s->topn_hist_n[lVar22][lVar26];
      piVar6 = ascr->senscr;
      puVar7 = ascr->sen_active;
      switch(bVar1) {
      case 1:
        iVar35 = s->n_sen;
        if (0 < iVar35) {
          pvVar4 = s->f[lVar26];
          puVar9 = s->mixw[lVar26][pvVar4->codeword];
          lVar19 = 0;
          do {
            if (puVar7[lVar19] != '\0') {
              piVar6[lVar19] = piVar6[lVar19] + ((uint)puVar9[lVar19] + pvVar4->score) * -0x400;
              iVar35 = s->n_sen;
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 < iVar35);
        }
        break;
      case 2:
        iVar35 = s->n_sen;
        if (0 < iVar35) {
          pvVar4 = s->f[lVar26];
          puVar9 = s->mixw[lVar26][pvVar4->codeword];
          puVar10 = s->mixw[lVar26][pvVar4[1].codeword];
          lVar19 = 0;
          do {
            if (puVar7[lVar19] != '\0') {
              iVar27 = (uint)puVar9[lVar19] + pvVar4->score;
              iVar35 = (uint)puVar10[lVar19] + pvVar4[1].score;
              uVar36 = iVar27 - iVar35;
              if (iVar27 < iVar35) {
                iVar35 = iVar27;
              }
              uVar29 = -uVar36;
              if (0 < (int)uVar36) {
                uVar29 = uVar36;
              }
              piVar6[lVar19] =
                   piVar6[lVar19] +
                   ((uint)*(byte *)((long)(s->lmath_8b->t).table + (ulong)uVar29) - iVar35) * 0x400;
              iVar35 = s->n_sen;
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 < iVar35);
        }
        break;
      case 3:
        iVar35 = s->n_sen;
        if (0 < iVar35) {
          ppuVar8 = s->mixw[lVar26];
          pvVar4 = s->f[lVar26];
          puVar9 = ppuVar8[pvVar4->codeword];
          puVar10 = ppuVar8[pvVar4[1].codeword];
          puVar11 = ppuVar8[pvVar4[2].codeword];
          lVar19 = 0;
          do {
            if (puVar7[lVar19] != '\0') {
              iVar27 = (uint)puVar9[lVar19] + pvVar4->score;
              iVar35 = (uint)puVar10[lVar19] + pvVar4[1].score;
              pvVar15 = (s->lmath_8b->t).table;
              uVar36 = iVar27 - iVar35;
              if (iVar27 < iVar35) {
                iVar35 = iVar27;
              }
              uVar29 = -uVar36;
              if (0 < (int)uVar36) {
                uVar29 = uVar36;
              }
              iVar35 = iVar35 - (uint)*(byte *)((long)pvVar15 + (ulong)uVar29);
              iVar27 = (uint)puVar11[lVar19] + pvVar4[2].score;
              uVar36 = iVar35 - iVar27;
              if (iVar35 < iVar27) {
                iVar27 = iVar35;
              }
              uVar29 = -uVar36;
              if (0 < (int)uVar36) {
                uVar29 = uVar36;
              }
              piVar6[lVar19] =
                   piVar6[lVar19] +
                   ((uint)*(byte *)((long)pvVar15 + (ulong)uVar29) - iVar27) * 0x400;
              iVar35 = s->n_sen;
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 < iVar35);
        }
        break;
      case 4:
        iVar35 = s->n_sen;
        if (0 < iVar35) {
          ppuVar8 = s->mixw[lVar26];
          pvVar4 = s->f[lVar26];
          puVar9 = ppuVar8[pvVar4->codeword];
          puVar10 = ppuVar8[pvVar4[1].codeword];
          puVar11 = ppuVar8[pvVar4[2].codeword];
          puVar12 = ppuVar8[pvVar4[3].codeword];
          lVar19 = 0;
          do {
            if (puVar7[lVar19] != '\0') {
              iVar27 = (uint)puVar9[lVar19] + pvVar4->score;
              iVar35 = (uint)puVar10[lVar19] + pvVar4[1].score;
              pvVar15 = (s->lmath_8b->t).table;
              uVar36 = iVar27 - iVar35;
              if (iVar27 < iVar35) {
                iVar35 = iVar27;
              }
              uVar29 = -uVar36;
              if (0 < (int)uVar36) {
                uVar29 = uVar36;
              }
              iVar35 = iVar35 - (uint)*(byte *)((long)pvVar15 + (ulong)uVar29);
              iVar27 = (uint)puVar11[lVar19] + pvVar4[2].score;
              uVar36 = iVar35 - iVar27;
              if (iVar35 < iVar27) {
                iVar27 = iVar35;
              }
              uVar29 = -uVar36;
              if (0 < (int)uVar36) {
                uVar29 = uVar36;
              }
              iVar27 = iVar27 - (uint)*(byte *)((long)pvVar15 + (ulong)uVar29);
              iVar35 = (uint)puVar12[lVar19] + pvVar4[3].score;
              uVar36 = iVar27 - iVar35;
              if (iVar27 < iVar35) {
                iVar35 = iVar27;
              }
              uVar29 = -uVar36;
              if (0 < (int)uVar36) {
                uVar29 = uVar36;
              }
              piVar6[lVar19] =
                   piVar6[lVar19] +
                   ((uint)*(byte *)((long)pvVar15 + (ulong)uVar29) - iVar35) * 0x400;
              iVar35 = s->n_sen;
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 < iVar35);
        }
        break;
      case 5:
        iVar35 = s->n_sen;
        if (0 < iVar35) {
          ppuVar8 = s->mixw[lVar26];
          pvVar4 = s->f[lVar26];
          puVar9 = ppuVar8[pvVar4->codeword];
          puVar10 = ppuVar8[pvVar4[1].codeword];
          puVar11 = ppuVar8[pvVar4[2].codeword];
          puVar12 = ppuVar8[pvVar4[3].codeword];
          puVar13 = ppuVar8[pvVar4[4].codeword];
          lVar19 = 0;
          do {
            if (puVar7[lVar19] != '\0') {
              iVar27 = (uint)puVar9[lVar19] + pvVar4->score;
              iVar35 = (uint)puVar10[lVar19] + pvVar4[1].score;
              uVar36 = iVar27 - iVar35;
              if (iVar27 < iVar35) {
                iVar35 = iVar27;
              }
              uVar29 = -uVar36;
              if (0 < (int)uVar36) {
                uVar29 = uVar36;
              }
              pvVar15 = (s->lmath_8b->t).table;
              iVar35 = iVar35 - (uint)*(byte *)((long)pvVar15 + (ulong)uVar29);
              iVar27 = (uint)puVar11[lVar19] + pvVar4[2].score;
              uVar36 = iVar35 - iVar27;
              if (iVar35 < iVar27) {
                iVar27 = iVar35;
              }
              uVar29 = -uVar36;
              if (0 < (int)uVar36) {
                uVar29 = uVar36;
              }
              iVar27 = iVar27 - (uint)*(byte *)((long)pvVar15 + (ulong)uVar29);
              iVar35 = (uint)puVar12[lVar19] + pvVar4[3].score;
              uVar36 = iVar27 - iVar35;
              if (iVar27 < iVar35) {
                iVar35 = iVar27;
              }
              uVar29 = -uVar36;
              if (0 < (int)uVar36) {
                uVar29 = uVar36;
              }
              iVar35 = iVar35 - (uint)*(byte *)((long)pvVar15 + (ulong)uVar29);
              iVar27 = (uint)puVar13[lVar19] + pvVar4[4].score;
              uVar36 = iVar35 - iVar27;
              if (iVar35 < iVar27) {
                iVar27 = iVar35;
              }
              uVar29 = -uVar36;
              if (0 < (int)uVar36) {
                uVar29 = uVar36;
              }
              piVar6[lVar19] =
                   piVar6[lVar19] +
                   ((uint)*(byte *)((long)pvVar15 + (ulong)uVar29) - iVar27) * 0x400;
              iVar35 = s->n_sen;
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 < iVar35);
        }
        break;
      case 6:
        iVar35 = s->n_sen;
        if (0 < iVar35) {
          ppuVar8 = s->mixw[lVar26];
          pvVar4 = s->f[lVar26];
          puVar9 = ppuVar8[pvVar4->codeword];
          puVar10 = ppuVar8[pvVar4[1].codeword];
          puVar11 = ppuVar8[pvVar4[2].codeword];
          puVar12 = ppuVar8[pvVar4[3].codeword];
          puVar13 = ppuVar8[pvVar4[4].codeword];
          puVar14 = ppuVar8[pvVar4[5].codeword];
          lVar19 = 0;
          do {
            if (puVar7[lVar19] != '\0') {
              iVar27 = (uint)puVar9[lVar19] + pvVar4->score;
              iVar35 = (uint)puVar10[lVar19] + pvVar4[1].score;
              pvVar15 = (s->lmath_8b->t).table;
              uVar36 = iVar27 - iVar35;
              if (iVar27 < iVar35) {
                iVar35 = iVar27;
              }
              uVar29 = -uVar36;
              if (0 < (int)uVar36) {
                uVar29 = uVar36;
              }
              iVar35 = iVar35 - (uint)*(byte *)((long)pvVar15 + (ulong)uVar29);
              iVar27 = (uint)puVar11[lVar19] + pvVar4[2].score;
              uVar36 = iVar35 - iVar27;
              if (iVar35 < iVar27) {
                iVar27 = iVar35;
              }
              uVar29 = -uVar36;
              if (0 < (int)uVar36) {
                uVar29 = uVar36;
              }
              iVar27 = iVar27 - (uint)*(byte *)((long)pvVar15 + (ulong)uVar29);
              iVar35 = (uint)puVar12[lVar19] + pvVar4[3].score;
              uVar36 = iVar27 - iVar35;
              if (iVar27 < iVar35) {
                iVar35 = iVar27;
              }
              uVar29 = -uVar36;
              if (0 < (int)uVar36) {
                uVar29 = uVar36;
              }
              iVar35 = iVar35 - (uint)*(byte *)((long)pvVar15 + (ulong)uVar29);
              iVar27 = (uint)puVar13[lVar19] + pvVar4[4].score;
              uVar36 = iVar35 - iVar27;
              if (iVar35 < iVar27) {
                iVar27 = iVar35;
              }
              uVar29 = -uVar36;
              if (0 < (int)uVar36) {
                uVar29 = uVar36;
              }
              iVar27 = iVar27 - (uint)*(byte *)((long)pvVar15 + (ulong)uVar29);
              iVar35 = (uint)puVar14[lVar19] + pvVar4[5].score;
              uVar36 = iVar27 - iVar35;
              if (iVar27 < iVar35) {
                iVar35 = iVar27;
              }
              uVar29 = -uVar36;
              if (0 < (int)uVar36) {
                uVar29 = uVar36;
              }
              piVar6[lVar19] =
                   piVar6[lVar19] +
                   ((uint)*(byte *)((long)pvVar15 + (ulong)uVar29) - iVar35) * 0x400;
              iVar35 = s->n_sen;
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 < iVar35);
        }
        break;
      default:
        iVar35 = s->n_sen;
        if (0 < iVar35) {
          lVar19 = 0;
          do {
            if (puVar7[lVar19] != '\0') {
              pvVar4 = s->f[lVar26];
              iVar35 = (uint)s->mixw[lVar26][pvVar4->codeword][lVar19] + pvVar4->score;
              if (1 < bVar1) {
                lVar31 = 0;
                do {
                  iVar27 = (uint)s->mixw[lVar26][pvVar4[lVar31 + 1].codeword][lVar19] +
                           pvVar4[lVar31 + 1].score;
                  uVar36 = iVar35 - iVar27;
                  if (iVar35 < iVar27) {
                    iVar27 = iVar35;
                  }
                  uVar29 = -uVar36;
                  if (0 < (int)uVar36) {
                    uVar29 = uVar36;
                  }
                  iVar35 = iVar27 - (uint)*(byte *)((long)(s->lmath_8b->t).table + (ulong)uVar29);
                  lVar31 = lVar31 + 1;
                } while ((ulong)bVar1 - 1 != lVar31);
              }
              piVar6[lVar19] = piVar6[lVar19] + iVar35 * -0x400;
              iVar35 = s->n_sen;
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 < iVar35);
        }
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 < s->n_feat);
  }
  return 0;
}

Assistant:

int
s2_semi_mgau_frame_eval(s2_semi_mgau_t *s,
                        ascr_t *ascr,
                        fast_gmm_t *fgmm,
                        mfcc_t **featbuf,
                        int32 frame)
{
    int i, topn_idx;

    memset(ascr->senscr, 0, s->n_sen * sizeof(*ascr->senscr));
    /* No bounds checking is done here, which just means you'll get
     * semi-random crap if you request a frame in the future or one
     * that's too far in the past. */
    topn_idx = frame % s->n_topn_hist;
    s->f = s->topn_hist[topn_idx];
    for (i = 0; i < s->n_feat; ++i) {
        /* For past frames this will already be computed. */
        if (frame >= s->frame_idx) {
            vqFeature_t **lastf;
            if (topn_idx == 0)
                lastf = s->topn_hist[s->n_topn_hist-1];
            else
                lastf = s->topn_hist[topn_idx-1];
            memcpy(s->f[i], lastf[i], sizeof(vqFeature_t) * s->max_topn);
            mgau_dist(s, frame, i, featbuf[i]);
            s->topn_hist_n[topn_idx][i] = mgau_norm(s, i);
        }
        get_scores_8b_feat(s, i, s->topn_hist_n[topn_idx][i],
                           ascr->senscr, ascr->sen_active);
    }

    return 0;
}